

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t24(void)

{
  byte bVar1;
  _Bool ok_11;
  _Bool ok_10;
  _Bool ok_9;
  _Bool ok_8;
  _Bool ok_7;
  _Bool ok_6;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  int pos;
  ALLEGRO_USTR *us;
  ALLEGRO_USTR_INFO info;
  char str [12];
  int local_2c;
  undefined8 local_28;
  undefined1 local_20 [20];
  undefined8 local_c;
  undefined4 local_4;
  
  local_c = 0xf4ac82e2bec30061;
  local_4 = 0xbfbf8f;
  local_28 = al_ref_buffer(local_20,&local_c,0xb);
  local_2c = 0;
  bVar1 = al_ustr_next(local_28,&local_2c);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 1) {
    log_printf("OK   %s\n","pos == 1");
  }
  else {
    log_printf("FAIL %s\n","pos == 1");
    error = error + 1;
  }
  bVar1 = al_ustr_next(local_28,&local_2c);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 2) {
    log_printf("OK   %s\n","pos == 2");
  }
  else {
    log_printf("FAIL %s\n","pos == 2");
    error = error + 1;
  }
  bVar1 = al_ustr_next(local_28,&local_2c);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 4) {
    log_printf("OK   %s\n","pos == 4");
  }
  else {
    log_printf("FAIL %s\n","pos == 4");
    error = error + 1;
  }
  bVar1 = al_ustr_next(local_28,&local_2c);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 7) {
    log_printf("OK   %s\n","pos == 7");
  }
  else {
    log_printf("FAIL %s\n","pos == 7");
    error = error + 1;
  }
  bVar1 = al_ustr_next(local_28,&local_2c);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_next(us, &pos)");
  }
  if (local_2c == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  bVar1 = al_ustr_next(local_28,&local_2c);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n","! al_ustr_next(us, &pos)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","! al_ustr_next(us, &pos)");
  }
  if (local_2c == 0xb) {
    log_printf("OK   %s\n","pos == 11");
  }
  else {
    log_printf("FAIL %s\n","pos == 11");
    error = error + 1;
  }
  return;
}

Assistant:

static void t24(void)
{
   const char str[] = "a\0þ€\xf4\x8f\xbf\xbf";
   ALLEGRO_USTR_INFO info;
   const ALLEGRO_USTR *us = al_ref_buffer(&info, str, sizeof(str) - 1);
   int pos = 0;

   CHECK(al_ustr_next(us, &pos));   /* a */
   CHECK(pos == 1);

   CHECK(al_ustr_next(us, &pos));   /* NUL */
   CHECK(pos == 2);

   CHECK(al_ustr_next(us, &pos));   /* þ */
   CHECK(pos == 4);

   CHECK(al_ustr_next(us, &pos));   /* € */
   CHECK(pos == 7);

   CHECK(al_ustr_next(us, &pos));   /* U+10FFFF */
   CHECK(pos == 11);

   CHECK(! al_ustr_next(us, &pos)); /* end */
   CHECK(pos == 11);
}